

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Utilities::read_file
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *file_path)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  ostream *this;
  string local_258 [8];
  string line;
  istream local_228 [8];
  ifstream myFile;
  string *file_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::ifstream::ifstream(local_228,file_path,8);
  std::__cxx11::string::string(local_258);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"Can not open the file");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_258);
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_258);
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

vector<string> Utilities::read_file(string file_path) {
    vector<string> vec;
    ifstream myFile(file_path);
    string line;
    if(myFile.is_open()){
        while(getline(myFile,line)){
            vec.push_back(line);
        }
    }else{
        cout << "Can not open the file" << endl;
    }
    myFile.close();
    return vec;
}